

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase358::run(TestCase358 *this)

{
  bool bVar1;
  NullableValue<capnp::StructSchema::Field> *pNVar2;
  Field *pFVar3;
  anon_class_8_1_89912de0 *extraout_RDX;
  anon_class_8_1_89912de0 *extraout_RDX_00;
  anon_class_8_1_89912de0 *extraout_RDX_01;
  anon_class_8_1_89912de0 *func;
  anon_class_8_1_89912de0 *extraout_RDX_02;
  anon_class_8_1_89912de0 *extraout_RDX_03;
  anon_class_8_1_89912de0 *extraout_RDX_04;
  anon_class_8_1_89912de0 *func_00;
  anon_class_8_1_89912de0 *extraout_RDX_05;
  anon_class_8_1_89912de0 *extraout_RDX_06;
  anon_class_8_1_89912de0 *extraout_RDX_07;
  anon_class_8_1_89912de0 *func_01;
  anon_class_8_1_89912de0 *extraout_RDX_08;
  anon_class_8_1_89912de0 *extraout_RDX_09;
  anon_class_8_1_89912de0 *paVar4;
  anon_class_8_1_89912de0 *extraout_RDX_10;
  anon_class_8_1_89912de0 *func_02;
  bool local_43a9;
  undefined1 auStack_43a8 [7];
  bool _kj_shouldLog_20;
  Maybe<kj::Exception> local_43a0;
  DebugExpression<kj::Maybe<kj::Exception>_> local_4208;
  undefined1 local_4070 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_20;
  undefined1 auStack_3eb0 [7];
  bool _kj_shouldLog_19;
  Maybe<kj::Exception> local_3ea8;
  DebugExpression<kj::Maybe<kj::Exception>_> local_3d10;
  undefined1 local_3b78 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_19;
  Reader local_39b0;
  Reader local_3978;
  ReaderFor<unsigned_int> local_392c;
  uint local_3928;
  bool local_3921;
  undefined1 auStack_3920 [7];
  bool _kj_shouldLog_18;
  Reader local_3910;
  Reader local_38d8;
  ReaderFor<unsigned_int> local_388c;
  uint local_3888;
  DebugExpression<unsigned_int> local_3884;
  undefined1 local_3880 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_18;
  Builder local_3850;
  BuilderFor<unsigned_int> local_380c;
  uint local_3808;
  bool local_3801;
  undefined1 auStack_3800 [7];
  bool _kj_shouldLog_17;
  Builder local_37f0;
  BuilderFor<unsigned_int> local_37ac;
  uint local_37a8;
  DebugExpression<unsigned_int> local_37a4;
  undefined1 local_37a0 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_17;
  Maybe<capnp::StructSchema::Field> local_3778;
  undefined1 local_3730 [8];
  NullableValue<capnp::StructSchema::Field> _kj_result_9;
  ArrayPtr<const_char> local_36a0;
  Field local_3690;
  bool local_3649;
  bool _kj_shouldLog_16;
  Maybe<capnp::StructSchema::Field> local_3640;
  undefined1 local_35f8 [8];
  NullableValue<capnp::StructSchema::Field> _kj_result_8;
  ArrayPtr<const_char> local_3568;
  Field local_3558;
  DebugExpression<capnp::StructSchema::Field> local_3518;
  undefined1 local_34d8 [8];
  DebugComparison<capnp::StructSchema::Field,_capnp::StructSchema::Field> _kjCondition_16;
  ArrayPtr<const_char> local_33f8;
  bool local_33e1;
  undefined1 auStack_33e0 [7];
  bool _kj_shouldLog_15;
  Maybe<kj::Exception> local_33d8;
  DebugExpression<kj::Maybe<kj::Exception>_> local_3240;
  undefined1 local_30a8 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_15;
  undefined1 auStack_2ee8 [7];
  bool _kj_shouldLog_14;
  Maybe<kj::Exception> local_2ee0;
  DebugExpression<kj::Maybe<kj::Exception>_> local_2d48;
  undefined1 local_2bb0 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_14;
  Reader local_29e8;
  Reader local_29b0;
  ReaderFor<unsigned_int> local_2964;
  uint local_2960;
  bool local_2959;
  undefined1 auStack_2958 [7];
  bool _kj_shouldLog_13;
  Reader local_2948;
  Reader local_2910;
  ReaderFor<unsigned_int> local_28c4;
  uint local_28c0;
  DebugExpression<unsigned_int> local_28bc;
  undefined1 local_28b8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_13;
  Builder local_2888;
  BuilderFor<unsigned_int> local_2844;
  uint local_2840;
  bool local_2839;
  undefined1 auStack_2838 [7];
  bool _kj_shouldLog_12;
  Builder local_2828;
  BuilderFor<unsigned_int> local_27e4;
  uint local_27e0;
  DebugExpression<unsigned_int> local_27dc;
  undefined1 local_27d8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_12;
  Maybe<capnp::StructSchema::Field> local_27b0;
  undefined1 local_2768 [8];
  NullableValue<capnp::StructSchema::Field> _kj_result_7;
  ArrayPtr<const_char> local_26d8;
  Field local_26c8;
  bool local_2681;
  bool _kj_shouldLog_11;
  Maybe<capnp::StructSchema::Field> local_2678;
  undefined1 local_2630 [8];
  NullableValue<capnp::StructSchema::Field> _kj_result_6;
  ArrayPtr<const_char> local_25a0;
  Field local_2590;
  DebugExpression<capnp::StructSchema::Field> local_2550;
  undefined1 local_2510 [8];
  DebugComparison<capnp::StructSchema::Field,_capnp::StructSchema::Field> _kjCondition_11;
  ArrayPtr<const_char> local_2430;
  bool local_2419;
  undefined1 auStack_2418 [7];
  bool _kj_shouldLog_10;
  Maybe<kj::Exception> local_2410;
  DebugExpression<kj::Maybe<kj::Exception>_> local_2278;
  undefined1 local_20e0 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_10;
  undefined1 auStack_1f20 [7];
  bool _kj_shouldLog_9;
  Maybe<kj::Exception> local_1f18;
  DebugExpression<kj::Maybe<kj::Exception>_> local_1d80;
  undefined1 local_1be8 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_9;
  Reader local_1a20;
  Reader local_19e8;
  ReaderFor<unsigned_int> local_199c;
  uint local_1998;
  bool local_1991;
  undefined1 auStack_1990 [7];
  bool _kj_shouldLog_8;
  Reader local_1980;
  Reader local_1948;
  ReaderFor<unsigned_int> local_18fc;
  uint local_18f8;
  DebugExpression<unsigned_int> local_18f4;
  undefined1 local_18f0 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_8;
  Builder local_18c0;
  BuilderFor<unsigned_int> local_187c;
  uint local_1878;
  bool local_1871;
  undefined1 auStack_1870 [7];
  bool _kj_shouldLog_7;
  Builder local_1860;
  BuilderFor<unsigned_int> local_181c;
  uint local_1818;
  DebugExpression<unsigned_int> local_1814;
  undefined1 local_1810 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_7;
  Maybe<capnp::StructSchema::Field> local_17e8;
  undefined1 local_17a0 [8];
  NullableValue<capnp::StructSchema::Field> _kj_result_5;
  ArrayPtr<const_char> local_1710;
  Field local_1700;
  bool local_16b9;
  bool _kj_shouldLog_6;
  Maybe<capnp::StructSchema::Field> local_16b0;
  undefined1 local_1668 [8];
  NullableValue<capnp::StructSchema::Field> _kj_result_4;
  ArrayPtr<const_char> local_15d8;
  Field local_15c8;
  DebugExpression<capnp::StructSchema::Field> local_1588;
  undefined1 local_1548 [8];
  DebugComparison<capnp::StructSchema::Field,_capnp::StructSchema::Field> _kjCondition_6;
  ArrayPtr<const_char> local_1468;
  bool local_1451;
  undefined1 auStack_1450 [7];
  bool _kj_shouldLog_5;
  Maybe<kj::Exception> local_1448;
  DebugExpression<kj::Maybe<kj::Exception>_> local_12b0;
  undefined1 local_1118 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_5;
  undefined1 auStack_f58 [7];
  bool _kj_shouldLog_4;
  Maybe<kj::Exception> local_f50;
  DebugExpression<kj::Maybe<kj::Exception>_> local_db8;
  undefined1 local_c20 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_4;
  Reader local_a58;
  Reader local_a20;
  ReaderFor<unsigned_int> local_9d4;
  uint local_9d0;
  bool local_9c9;
  undefined1 auStack_9c8 [7];
  bool _kj_shouldLog_3;
  Reader local_9b8;
  Reader local_980;
  ReaderFor<unsigned_int> local_934;
  uint local_930;
  DebugExpression<unsigned_int> local_92c;
  undefined1 local_928 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_3;
  Builder local_8f8;
  BuilderFor<unsigned_int> local_8b4;
  uint local_8b0;
  bool local_8a9;
  undefined1 auStack_8a8 [7];
  bool _kj_shouldLog_2;
  Builder local_898;
  BuilderFor<unsigned_int> local_854;
  uint local_850;
  DebugExpression<unsigned_int> local_84c;
  undefined1 local_848 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_2;
  Maybe<capnp::StructSchema::Field> local_820;
  undefined1 local_7d8 [8];
  NullableValue<capnp::StructSchema::Field> _kj_result_3;
  ArrayPtr<const_char> local_748;
  Field local_738;
  bool local_6f1;
  bool _kj_shouldLog_1;
  Maybe<capnp::StructSchema::Field> local_6e8;
  undefined1 local_6a0 [8];
  NullableValue<capnp::StructSchema::Field> _kj_result_2;
  ArrayPtr<const_char> local_610;
  Field local_600;
  DebugExpression<capnp::StructSchema::Field> local_5c0;
  undefined1 local_580 [8];
  DebugComparison<capnp::StructSchema::Field,_capnp::StructSchema::Field> _kjCondition_1;
  ArrayPtr<const_char> local_4a0;
  Fault local_490;
  Maybe<capnp::StructSchema::Field> local_488;
  undefined1 local_440 [8];
  NullableValue<capnp::StructSchema::Field> _kj_result_1;
  ArrayPtr<const_char> local_3b0;
  Field local_3a0;
  bool local_359;
  bool _kj_shouldLog;
  Maybe<capnp::StructSchema::Field> local_350;
  undefined1 local_308 [8];
  NullableValue<capnp::StructSchema::Field> _kj_result;
  ArrayPtr<const_char> local_278;
  Field local_268;
  DebugExpression<capnp::StructSchema::Field> local_228;
  undefined1 local_1e8 [8];
  DebugComparison<capnp::StructSchema::Field,_capnp::StructSchema::Field> _kjCondition;
  undefined1 local_148 [8];
  Builder root;
  Schema local_108;
  StructSchema schema;
  MallocMessageBuilder builder;
  TestCase358 *this_local;
  
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&schema,0x400,GROW_HEURISTICALLY);
  _kjCondition._144_8_ = Schema::from<capnproto_test::capnp::test::TestUnnamedUnion>();
  local_108.raw = (RawBrandedSchema *)_kjCondition._144_8_;
  MessageBuilder::initRoot<capnp::DynamicStruct,capnp::StructSchema>
            ((Builder *)local_148,(MessageBuilder *)&schema,(StructSchema)_kjCondition._144_8_);
  kj::StringPtr::StringPtr((StringPtr *)&local_278,"foo");
  StructSchema::getFieldByName(&local_268,(StructSchema *)&local_108,(StringPtr)local_278);
  kj::_::DebugExpressionStart::operator<<
            (&local_228,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_268);
  DynamicStruct::Builder::which(&local_350,(Builder *)local_148);
  pNVar2 = kj::_::readMaybe<capnp::StructSchema::Field>(&local_350);
  kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
            ((NullableValue<capnp::StructSchema::Field> *)local_308,pNVar2);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_350);
  pFVar3 = kj::_::NullableValue::operator_cast_to_Field_((NullableValue *)local_308);
  if (pFVar3 == (Field *)0x0) {
    kj::_::Debug::Fault::Fault
              ((Fault *)&stack0xfffffffffffffca8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x16b,FAILED,"root.which() != nullptr","");
    kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffca8);
  }
  pNVar2 = kj::mv<kj::_::NullableValue<capnp::StructSchema::Field>>
                     ((NullableValue<capnp::StructSchema::Field> *)local_308);
  kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
            ((NullableValue<capnp::StructSchema::Field> *)
             &_kj_result.field_1.value.proto._reader.nestingLimit,pNVar2);
  kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
            ((NullableValue<capnp::StructSchema::Field> *)local_308);
  pFVar3 = kj::_::NullableValue<capnp::StructSchema::Field>::operator*
                     ((NullableValue<capnp::StructSchema::Field> *)
                      &_kj_result.field_1.value.proto._reader.nestingLimit);
  kj::_::DebugExpression<capnp::StructSchema::Field>::operator==
            ((DebugComparison<capnp::StructSchema::Field,_capnp::StructSchema::Field> *)local_1e8,
             &local_228,pFVar3);
  kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
            ((NullableValue<capnp::StructSchema::Field> *)
             &_kj_result.field_1.value.proto._reader.nestingLimit);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1e8);
  if (!bVar1) {
    local_359 = kj::_::Debug::shouldLog(ERROR);
    while (local_359 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_3b0,"foo");
      StructSchema::getFieldByName(&local_3a0,(StructSchema *)&local_108,(StringPtr)local_3b0);
      DynamicStruct::Builder::which(&local_488,(Builder *)local_148);
      pNVar2 = kj::_::readMaybe<capnp::StructSchema::Field>(&local_488);
      kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
                ((NullableValue<capnp::StructSchema::Field> *)local_440,pNVar2);
      kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_488);
      pFVar3 = kj::_::NullableValue::operator_cast_to_Field_((NullableValue *)local_440);
      if (pFVar3 == (Field *)0x0) {
        kj::_::Debug::Fault::Fault
                  (&local_490,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                   ,0x16b,FAILED,"root.which() != nullptr","");
        kj::_::Debug::Fault::fatal(&local_490);
      }
      pNVar2 = kj::mv<kj::_::NullableValue<capnp::StructSchema::Field>>
                         ((NullableValue<capnp::StructSchema::Field> *)local_440);
      kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
                ((NullableValue<capnp::StructSchema::Field> *)
                 &_kj_result_1.field_1.value.proto._reader.nestingLimit,pNVar2);
      kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
                ((NullableValue<capnp::StructSchema::Field> *)local_440);
      pFVar3 = kj::_::NullableValue<capnp::StructSchema::Field>::operator*
                         ((NullableValue<capnp::StructSchema::Field> *)
                          &_kj_result_1.field_1.value.proto._reader.nestingLimit);
      kj::_::Debug::
      log<char_const(&)[387],kj::_::DebugComparison<capnp::StructSchema::Field,capnp::StructSchema::Field>&,capnp::StructSchema::Field,capnp::StructSchema::Field>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x16b,ERROR,
                 "\"failed: expected \" \"(schema.getFieldByName(\\\"foo\\\")) == ((*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\\\", 363, ::kj::Exception::Type::FAILED, \\\"root.which()\\\" \\\" != nullptr\\\", \\\"\\\").fatal(); } kj::mv(_kj_result); })))\", _kjCondition, schema.getFieldByName(\"foo\"), (*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\", 363, ::kj::Exception::Type::FAILED, \"root.which()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); }))"
                 ,(char (*) [387])
                  "failed: expected (schema.getFieldByName(\"foo\")) == ((*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\", 363, ::kj::Exception::Type::FAILED, \"root.which()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); })))"
                 ,(DebugComparison<capnp::StructSchema::Field,_capnp::StructSchema::Field> *)
                  local_1e8,&local_3a0,pFVar3);
      kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
                ((NullableValue<capnp::StructSchema::Field> *)
                 &_kj_result_1.field_1.value.proto._reader.nestingLimit);
      local_359 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_4a0,"bar");
  DynamicValue::Reader::Reader((Reader *)&_kjCondition_1.result,0x141);
  DynamicStruct::Builder::set
            ((Builder *)local_148,(StringPtr)local_4a0,(Reader *)&_kjCondition_1.result);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_1.result);
  kj::StringPtr::StringPtr((StringPtr *)&local_610,"bar");
  StructSchema::getFieldByName(&local_600,(StructSchema *)&local_108,(StringPtr)local_610);
  kj::_::DebugExpressionStart::operator<<
            (&local_5c0,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_600);
  DynamicStruct::Builder::which(&local_6e8,(Builder *)local_148);
  pNVar2 = kj::_::readMaybe<capnp::StructSchema::Field>(&local_6e8);
  kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
            ((NullableValue<capnp::StructSchema::Field> *)local_6a0,pNVar2);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_6e8);
  pFVar3 = kj::_::NullableValue::operator_cast_to_Field_((NullableValue *)local_6a0);
  if (pFVar3 == (Field *)0x0) {
    kj::_::Debug::Fault::Fault
              ((Fault *)&stack0xfffffffffffff910,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x16e,FAILED,"root.which() != nullptr","");
    kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffff910);
  }
  pNVar2 = kj::mv<kj::_::NullableValue<capnp::StructSchema::Field>>
                     ((NullableValue<capnp::StructSchema::Field> *)local_6a0);
  kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
            ((NullableValue<capnp::StructSchema::Field> *)
             &_kj_result_2.field_1.value.proto._reader.nestingLimit,pNVar2);
  kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
            ((NullableValue<capnp::StructSchema::Field> *)local_6a0);
  pFVar3 = kj::_::NullableValue<capnp::StructSchema::Field>::operator*
                     ((NullableValue<capnp::StructSchema::Field> *)
                      &_kj_result_2.field_1.value.proto._reader.nestingLimit);
  kj::_::DebugExpression<capnp::StructSchema::Field>::operator==
            ((DebugComparison<capnp::StructSchema::Field,_capnp::StructSchema::Field> *)local_580,
             &local_5c0,pFVar3);
  kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
            ((NullableValue<capnp::StructSchema::Field> *)
             &_kj_result_2.field_1.value.proto._reader.nestingLimit);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_580);
  if (!bVar1) {
    local_6f1 = kj::_::Debug::shouldLog(ERROR);
    while (local_6f1 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_748,"bar");
      StructSchema::getFieldByName(&local_738,(StructSchema *)&local_108,(StringPtr)local_748);
      DynamicStruct::Builder::which(&local_820,(Builder *)local_148);
      pNVar2 = kj::_::readMaybe<capnp::StructSchema::Field>(&local_820);
      kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
                ((NullableValue<capnp::StructSchema::Field> *)local_7d8,pNVar2);
      kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_820);
      pFVar3 = kj::_::NullableValue::operator_cast_to_Field_((NullableValue *)local_7d8);
      if (pFVar3 == (Field *)0x0) {
        kj::_::Debug::Fault::Fault
                  ((Fault *)&_kjCondition_2.result,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                   ,0x16e,FAILED,"root.which() != nullptr","");
        kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_2.result);
      }
      pNVar2 = kj::mv<kj::_::NullableValue<capnp::StructSchema::Field>>
                         ((NullableValue<capnp::StructSchema::Field> *)local_7d8);
      kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
                ((NullableValue<capnp::StructSchema::Field> *)
                 &_kj_result_3.field_1.value.proto._reader.nestingLimit,pNVar2);
      kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
                ((NullableValue<capnp::StructSchema::Field> *)local_7d8);
      pFVar3 = kj::_::NullableValue<capnp::StructSchema::Field>::operator*
                         ((NullableValue<capnp::StructSchema::Field> *)
                          &_kj_result_3.field_1.value.proto._reader.nestingLimit);
      kj::_::Debug::
      log<char_const(&)[387],kj::_::DebugComparison<capnp::StructSchema::Field,capnp::StructSchema::Field>&,capnp::StructSchema::Field,capnp::StructSchema::Field>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x16e,ERROR,
                 "\"failed: expected \" \"(schema.getFieldByName(\\\"bar\\\")) == ((*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\\\", 366, ::kj::Exception::Type::FAILED, \\\"root.which()\\\" \\\" != nullptr\\\", \\\"\\\").fatal(); } kj::mv(_kj_result); })))\", _kjCondition, schema.getFieldByName(\"bar\"), (*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\", 366, ::kj::Exception::Type::FAILED, \"root.which()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); }))"
                 ,(char (*) [387])
                  "failed: expected (schema.getFieldByName(\"bar\")) == ((*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\", 366, ::kj::Exception::Type::FAILED, \"root.which()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); })))"
                 ,(DebugComparison<capnp::StructSchema::Field,_capnp::StructSchema::Field> *)
                  local_580,&local_738,pFVar3);
      kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
                ((NullableValue<capnp::StructSchema::Field> *)
                 &_kj_result_3.field_1.value.proto._reader.nestingLimit);
      local_6f1 = false;
    }
  }
  local_850 = 0x141;
  local_84c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_850);
  kj::StringPtr::StringPtr((StringPtr *)auStack_8a8,"bar");
  DynamicStruct::Builder::get(&local_898,(Builder *)local_148,(StringPtr)_auStack_8a8);
  local_854 = DynamicValue::Builder::as<unsigned_int>(&local_898);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_848,&local_84c,&local_854);
  DynamicValue::Builder::~Builder(&local_898);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_848);
  if (!bVar1) {
    local_8a9 = kj::_::Debug::shouldLog(ERROR);
    while (local_8a9 != false) {
      local_8b0 = 0x141;
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_3.result,"bar");
      DynamicStruct::Builder::get
                (&local_8f8,(Builder *)local_148,(StringPtr)stack0xfffffffffffff6f8);
      local_8b4 = DynamicValue::Builder::as<unsigned_int>(&local_8f8);
      kj::_::Debug::
      log<char_const(&)[56],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x16f,ERROR,
                 "\"failed: expected \" \"(321u) == (root.get(\\\"bar\\\").as<uint>())\", _kjCondition, 321u, root.get(\"bar\").as<uint>()"
                 ,(char (*) [56])"failed: expected (321u) == (root.get(\"bar\").as<uint>())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_848,&local_8b0,&local_8b4);
      DynamicValue::Builder::~Builder(&local_8f8);
      local_8a9 = false;
    }
  }
  local_930 = 0x141;
  local_92c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_930);
  DynamicStruct::Builder::asReader(&local_9b8,(Builder *)local_148);
  kj::StringPtr::StringPtr((StringPtr *)auStack_9c8,"bar");
  DynamicStruct::Reader::get(&local_980,&local_9b8,(StringPtr)_auStack_9c8);
  local_934 = DynamicValue::Reader::as<unsigned_int>(&local_980);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_928,&local_92c,&local_934);
  DynamicValue::Reader::~Reader(&local_980);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_928);
  paVar4 = extraout_RDX;
  if (!bVar1) {
    local_9c9 = kj::_::Debug::shouldLog(ERROR);
    paVar4 = extraout_RDX_00;
    while (local_9c9 != false) {
      local_9d0 = 0x141;
      DynamicStruct::Builder::asReader(&local_a58,(Builder *)local_148);
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_4.result,"bar");
      DynamicStruct::Reader::get(&local_a20,&local_a58,(StringPtr)stack0xfffffffffffff598);
      local_9d4 = DynamicValue::Reader::as<unsigned_int>(&local_a20);
      kj::_::Debug::
      log<char_const(&)[67],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x170,ERROR,
                 "\"failed: expected \" \"(321u) == (root.asReader().get(\\\"bar\\\").as<uint>())\", _kjCondition, 321u, root.asReader().get(\"bar\").as<uint>()"
                 ,(char (*) [67])
                  "failed: expected (321u) == (root.asReader().get(\"bar\").as<uint>())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_928,&local_9d0,&local_9d4);
      DynamicValue::Reader::~Reader(&local_a20);
      paVar4 = extraout_RDX_01;
      local_9c9 = false;
    }
  }
  _auStack_f58 = local_148;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase358::run()::__0>
            (&local_f50,(kj *)auStack_f58,paVar4);
  kj::_::DebugExpressionStart::operator<<
            (&local_db8,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_f50);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_c20,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&local_db8,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_db8);
  kj::Maybe<kj::Exception>::~Maybe(&local_f50);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_c20);
  if (!bVar1) {
    _kjCondition_5._439_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_5._439_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[85],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x171,ERROR,
                 "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.get(\\\"foo\\\"); }) != kj::none\", _kjCondition"
                 ,(char (*) [85])
                  "failed: expected ::kj::runCatchingExceptions([&]() { root.get(\"foo\"); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_c20);
      _kjCondition_5._439_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_c20);
  _auStack_1450 = local_148;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase358::run()::__1>
            (&local_1448,(kj *)auStack_1450,func);
  kj::_::DebugExpressionStart::operator<<
            (&local_12b0,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1448);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_1118,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&local_12b0,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_12b0);
  kj::Maybe<kj::Exception>::~Maybe(&local_1448);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1118);
  if (!bVar1) {
    local_1451 = kj::_::Debug::shouldLog(ERROR);
    while (local_1451 != false) {
      kj::_::Debug::
      log<char_const(&)[96],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x172,ERROR,
                 "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.asReader().get(\\\"foo\\\"); }) != kj::none\", _kjCondition"
                 ,(char (*) [96])
                  "failed: expected ::kj::runCatchingExceptions([&]() { root.asReader().get(\"foo\"); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_1118);
      local_1451 = false;
    }
  }
  kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_1118);
  kj::StringPtr::StringPtr((StringPtr *)&local_1468,"foo");
  DynamicValue::Reader::Reader((Reader *)&_kjCondition_6.result,0x7b);
  DynamicStruct::Builder::set
            ((Builder *)local_148,(StringPtr)local_1468,(Reader *)&_kjCondition_6.result);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_6.result);
  kj::StringPtr::StringPtr((StringPtr *)&local_15d8,"foo");
  StructSchema::getFieldByName(&local_15c8,(StructSchema *)&local_108,(StringPtr)local_15d8);
  kj::_::DebugExpressionStart::operator<<
            (&local_1588,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_15c8);
  DynamicStruct::Builder::which(&local_16b0,(Builder *)local_148);
  pNVar2 = kj::_::readMaybe<capnp::StructSchema::Field>(&local_16b0);
  kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
            ((NullableValue<capnp::StructSchema::Field> *)local_1668,pNVar2);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_16b0);
  pFVar3 = kj::_::NullableValue::operator_cast_to_Field_((NullableValue *)local_1668);
  if (pFVar3 == (Field *)0x0) {
    kj::_::Debug::Fault::Fault
              ((Fault *)&stack0xffffffffffffe948,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x175,FAILED,"root.which() != nullptr","");
    kj::_::Debug::Fault::fatal((Fault *)&stack0xffffffffffffe948);
  }
  pNVar2 = kj::mv<kj::_::NullableValue<capnp::StructSchema::Field>>
                     ((NullableValue<capnp::StructSchema::Field> *)local_1668);
  kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
            ((NullableValue<capnp::StructSchema::Field> *)
             &_kj_result_4.field_1.value.proto._reader.nestingLimit,pNVar2);
  kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
            ((NullableValue<capnp::StructSchema::Field> *)local_1668);
  pFVar3 = kj::_::NullableValue<capnp::StructSchema::Field>::operator*
                     ((NullableValue<capnp::StructSchema::Field> *)
                      &_kj_result_4.field_1.value.proto._reader.nestingLimit);
  kj::_::DebugExpression<capnp::StructSchema::Field>::operator==
            ((DebugComparison<capnp::StructSchema::Field,_capnp::StructSchema::Field> *)local_1548,
             &local_1588,pFVar3);
  kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
            ((NullableValue<capnp::StructSchema::Field> *)
             &_kj_result_4.field_1.value.proto._reader.nestingLimit);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1548);
  if (!bVar1) {
    local_16b9 = kj::_::Debug::shouldLog(ERROR);
    while (local_16b9 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_1710,"foo");
      StructSchema::getFieldByName(&local_1700,(StructSchema *)&local_108,(StringPtr)local_1710);
      DynamicStruct::Builder::which(&local_17e8,(Builder *)local_148);
      pNVar2 = kj::_::readMaybe<capnp::StructSchema::Field>(&local_17e8);
      kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
                ((NullableValue<capnp::StructSchema::Field> *)local_17a0,pNVar2);
      kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_17e8);
      pFVar3 = kj::_::NullableValue::operator_cast_to_Field_((NullableValue *)local_17a0);
      if (pFVar3 == (Field *)0x0) {
        kj::_::Debug::Fault::Fault
                  ((Fault *)&_kjCondition_7.result,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                   ,0x175,FAILED,"root.which() != nullptr","");
        kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_7.result);
      }
      pNVar2 = kj::mv<kj::_::NullableValue<capnp::StructSchema::Field>>
                         ((NullableValue<capnp::StructSchema::Field> *)local_17a0);
      kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
                ((NullableValue<capnp::StructSchema::Field> *)
                 &_kj_result_5.field_1.value.proto._reader.nestingLimit,pNVar2);
      kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
                ((NullableValue<capnp::StructSchema::Field> *)local_17a0);
      pFVar3 = kj::_::NullableValue<capnp::StructSchema::Field>::operator*
                         ((NullableValue<capnp::StructSchema::Field> *)
                          &_kj_result_5.field_1.value.proto._reader.nestingLimit);
      kj::_::Debug::
      log<char_const(&)[387],kj::_::DebugComparison<capnp::StructSchema::Field,capnp::StructSchema::Field>&,capnp::StructSchema::Field,capnp::StructSchema::Field>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x175,ERROR,
                 "\"failed: expected \" \"(schema.getFieldByName(\\\"foo\\\")) == ((*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\\\", 373, ::kj::Exception::Type::FAILED, \\\"root.which()\\\" \\\" != nullptr\\\", \\\"\\\").fatal(); } kj::mv(_kj_result); })))\", _kjCondition, schema.getFieldByName(\"foo\"), (*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\", 373, ::kj::Exception::Type::FAILED, \"root.which()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); }))"
                 ,(char (*) [387])
                  "failed: expected (schema.getFieldByName(\"foo\")) == ((*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\", 373, ::kj::Exception::Type::FAILED, \"root.which()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); })))"
                 ,(DebugComparison<capnp::StructSchema::Field,_capnp::StructSchema::Field> *)
                  local_1548,&local_1700,pFVar3);
      kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
                ((NullableValue<capnp::StructSchema::Field> *)
                 &_kj_result_5.field_1.value.proto._reader.nestingLimit);
      local_16b9 = false;
    }
  }
  local_1818 = 0x7b;
  local_1814 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1818);
  kj::StringPtr::StringPtr((StringPtr *)auStack_1870,"foo");
  DynamicStruct::Builder::get(&local_1860,(Builder *)local_148,(StringPtr)_auStack_1870);
  local_181c = DynamicValue::Builder::as<unsigned_int>(&local_1860);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_1810,&local_1814,&local_181c);
  DynamicValue::Builder::~Builder(&local_1860);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1810);
  if (!bVar1) {
    local_1871 = kj::_::Debug::shouldLog(ERROR);
    while (local_1871 != false) {
      local_1878 = 0x7b;
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_8.result,"foo");
      DynamicStruct::Builder::get
                (&local_18c0,(Builder *)local_148,(StringPtr)stack0xffffffffffffe730);
      local_187c = DynamicValue::Builder::as<unsigned_int>(&local_18c0);
      kj::_::Debug::
      log<char_const(&)[56],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x176,ERROR,
                 "\"failed: expected \" \"(123u) == (root.get(\\\"foo\\\").as<uint>())\", _kjCondition, 123u, root.get(\"foo\").as<uint>()"
                 ,(char (*) [56])"failed: expected (123u) == (root.get(\"foo\").as<uint>())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_1810,&local_1878,&local_187c);
      DynamicValue::Builder::~Builder(&local_18c0);
      local_1871 = false;
    }
  }
  local_18f8 = 0x7b;
  local_18f4 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_18f8);
  DynamicStruct::Builder::asReader(&local_1980,(Builder *)local_148);
  kj::StringPtr::StringPtr((StringPtr *)auStack_1990,"foo");
  DynamicStruct::Reader::get(&local_1948,&local_1980,(StringPtr)_auStack_1990);
  local_18fc = DynamicValue::Reader::as<unsigned_int>(&local_1948);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_18f0,&local_18f4,&local_18fc);
  DynamicValue::Reader::~Reader(&local_1948);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_18f0);
  paVar4 = extraout_RDX_02;
  if (!bVar1) {
    local_1991 = kj::_::Debug::shouldLog(ERROR);
    paVar4 = extraout_RDX_03;
    while (local_1991 != false) {
      local_1998 = 0x7b;
      DynamicStruct::Builder::asReader(&local_1a20,(Builder *)local_148);
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_9.result,"foo");
      DynamicStruct::Reader::get(&local_19e8,&local_1a20,(StringPtr)stack0xffffffffffffe5d0);
      local_199c = DynamicValue::Reader::as<unsigned_int>(&local_19e8);
      kj::_::Debug::
      log<char_const(&)[67],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x177,ERROR,
                 "\"failed: expected \" \"(123u) == (root.asReader().get(\\\"foo\\\").as<uint>())\", _kjCondition, 123u, root.asReader().get(\"foo\").as<uint>()"
                 ,(char (*) [67])
                  "failed: expected (123u) == (root.asReader().get(\"foo\").as<uint>())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_18f0,&local_1998,&local_199c);
      DynamicValue::Reader::~Reader(&local_19e8);
      paVar4 = extraout_RDX_04;
      local_1991 = false;
    }
  }
  _auStack_1f20 = local_148;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase358::run()::__2>
            (&local_1f18,(kj *)auStack_1f20,paVar4);
  kj::_::DebugExpressionStart::operator<<
            (&local_1d80,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1f18);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_1be8,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&local_1d80,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_1d80);
  kj::Maybe<kj::Exception>::~Maybe(&local_1f18);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1be8);
  if (!bVar1) {
    _kjCondition_10._439_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_10._439_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[85],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x178,ERROR,
                 "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.get(\\\"bar\\\"); }) != kj::none\", _kjCondition"
                 ,(char (*) [85])
                  "failed: expected ::kj::runCatchingExceptions([&]() { root.get(\"bar\"); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_1be8);
      _kjCondition_10._439_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_1be8);
  _auStack_2418 = local_148;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase358::run()::__3>
            (&local_2410,(kj *)auStack_2418,func_00);
  kj::_::DebugExpressionStart::operator<<
            (&local_2278,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_2410);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_20e0,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&local_2278,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_2278);
  kj::Maybe<kj::Exception>::~Maybe(&local_2410);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_20e0);
  if (!bVar1) {
    local_2419 = kj::_::Debug::shouldLog(ERROR);
    while (local_2419 != false) {
      kj::_::Debug::
      log<char_const(&)[96],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x179,ERROR,
                 "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.asReader().get(\\\"bar\\\"); }) != kj::none\", _kjCondition"
                 ,(char (*) [96])
                  "failed: expected ::kj::runCatchingExceptions([&]() { root.asReader().get(\"bar\"); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_20e0);
      local_2419 = false;
    }
  }
  kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_20e0);
  kj::StringPtr::StringPtr((StringPtr *)&local_2430,"bar");
  DynamicValue::Reader::Reader((Reader *)&_kjCondition_11.result,0x141);
  DynamicStruct::Builder::set
            ((Builder *)local_148,(StringPtr)local_2430,(Reader *)&_kjCondition_11.result);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_11.result);
  kj::StringPtr::StringPtr((StringPtr *)&local_25a0,"bar");
  StructSchema::getFieldByName(&local_2590,(StructSchema *)&local_108,(StringPtr)local_25a0);
  kj::_::DebugExpressionStart::operator<<
            (&local_2550,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_2590);
  DynamicStruct::Builder::which(&local_2678,(Builder *)local_148);
  pNVar2 = kj::_::readMaybe<capnp::StructSchema::Field>(&local_2678);
  kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
            ((NullableValue<capnp::StructSchema::Field> *)local_2630,pNVar2);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_2678);
  pFVar3 = kj::_::NullableValue::operator_cast_to_Field_((NullableValue *)local_2630);
  if (pFVar3 == (Field *)0x0) {
    kj::_::Debug::Fault::Fault
              ((Fault *)&stack0xffffffffffffd980,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x17c,FAILED,"root.which() != nullptr","");
    kj::_::Debug::Fault::fatal((Fault *)&stack0xffffffffffffd980);
  }
  pNVar2 = kj::mv<kj::_::NullableValue<capnp::StructSchema::Field>>
                     ((NullableValue<capnp::StructSchema::Field> *)local_2630);
  kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
            ((NullableValue<capnp::StructSchema::Field> *)
             &_kj_result_6.field_1.value.proto._reader.nestingLimit,pNVar2);
  kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
            ((NullableValue<capnp::StructSchema::Field> *)local_2630);
  pFVar3 = kj::_::NullableValue<capnp::StructSchema::Field>::operator*
                     ((NullableValue<capnp::StructSchema::Field> *)
                      &_kj_result_6.field_1.value.proto._reader.nestingLimit);
  kj::_::DebugExpression<capnp::StructSchema::Field>::operator==
            ((DebugComparison<capnp::StructSchema::Field,_capnp::StructSchema::Field> *)local_2510,
             &local_2550,pFVar3);
  kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
            ((NullableValue<capnp::StructSchema::Field> *)
             &_kj_result_6.field_1.value.proto._reader.nestingLimit);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2510);
  if (!bVar1) {
    local_2681 = kj::_::Debug::shouldLog(ERROR);
    while (local_2681 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_26d8,"bar");
      StructSchema::getFieldByName(&local_26c8,(StructSchema *)&local_108,(StringPtr)local_26d8);
      DynamicStruct::Builder::which(&local_27b0,(Builder *)local_148);
      pNVar2 = kj::_::readMaybe<capnp::StructSchema::Field>(&local_27b0);
      kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
                ((NullableValue<capnp::StructSchema::Field> *)local_2768,pNVar2);
      kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_27b0);
      pFVar3 = kj::_::NullableValue::operator_cast_to_Field_((NullableValue *)local_2768);
      if (pFVar3 == (Field *)0x0) {
        kj::_::Debug::Fault::Fault
                  ((Fault *)&_kjCondition_12.result,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                   ,0x17c,FAILED,"root.which() != nullptr","");
        kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_12.result);
      }
      pNVar2 = kj::mv<kj::_::NullableValue<capnp::StructSchema::Field>>
                         ((NullableValue<capnp::StructSchema::Field> *)local_2768);
      kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
                ((NullableValue<capnp::StructSchema::Field> *)
                 &_kj_result_7.field_1.value.proto._reader.nestingLimit,pNVar2);
      kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
                ((NullableValue<capnp::StructSchema::Field> *)local_2768);
      pFVar3 = kj::_::NullableValue<capnp::StructSchema::Field>::operator*
                         ((NullableValue<capnp::StructSchema::Field> *)
                          &_kj_result_7.field_1.value.proto._reader.nestingLimit);
      kj::_::Debug::
      log<char_const(&)[387],kj::_::DebugComparison<capnp::StructSchema::Field,capnp::StructSchema::Field>&,capnp::StructSchema::Field,capnp::StructSchema::Field>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x17c,ERROR,
                 "\"failed: expected \" \"(schema.getFieldByName(\\\"bar\\\")) == ((*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\\\", 380, ::kj::Exception::Type::FAILED, \\\"root.which()\\\" \\\" != nullptr\\\", \\\"\\\").fatal(); } kj::mv(_kj_result); })))\", _kjCondition, schema.getFieldByName(\"bar\"), (*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\", 380, ::kj::Exception::Type::FAILED, \"root.which()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); }))"
                 ,(char (*) [387])
                  "failed: expected (schema.getFieldByName(\"bar\")) == ((*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\", 380, ::kj::Exception::Type::FAILED, \"root.which()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); })))"
                 ,(DebugComparison<capnp::StructSchema::Field,_capnp::StructSchema::Field> *)
                  local_2510,&local_26c8,pFVar3);
      kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
                ((NullableValue<capnp::StructSchema::Field> *)
                 &_kj_result_7.field_1.value.proto._reader.nestingLimit);
      local_2681 = false;
    }
  }
  local_27e0 = 0x141;
  local_27dc = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_27e0);
  kj::StringPtr::StringPtr((StringPtr *)auStack_2838,"bar");
  DynamicStruct::Builder::get(&local_2828,(Builder *)local_148,(StringPtr)_auStack_2838);
  local_27e4 = DynamicValue::Builder::as<unsigned_int>(&local_2828);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_27d8,&local_27dc,&local_27e4);
  DynamicValue::Builder::~Builder(&local_2828);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_27d8);
  if (!bVar1) {
    local_2839 = kj::_::Debug::shouldLog(ERROR);
    while (local_2839 != false) {
      local_2840 = 0x141;
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_13.result,"bar");
      DynamicStruct::Builder::get
                (&local_2888,(Builder *)local_148,(StringPtr)stack0xffffffffffffd768);
      local_2844 = DynamicValue::Builder::as<unsigned_int>(&local_2888);
      kj::_::Debug::
      log<char_const(&)[56],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x17d,ERROR,
                 "\"failed: expected \" \"(321u) == (root.get(\\\"bar\\\").as<uint>())\", _kjCondition, 321u, root.get(\"bar\").as<uint>()"
                 ,(char (*) [56])"failed: expected (321u) == (root.get(\"bar\").as<uint>())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_27d8,&local_2840,&local_2844);
      DynamicValue::Builder::~Builder(&local_2888);
      local_2839 = false;
    }
  }
  local_28c0 = 0x141;
  local_28bc = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_28c0);
  DynamicStruct::Builder::asReader(&local_2948,(Builder *)local_148);
  kj::StringPtr::StringPtr((StringPtr *)auStack_2958,"bar");
  DynamicStruct::Reader::get(&local_2910,&local_2948,(StringPtr)_auStack_2958);
  local_28c4 = DynamicValue::Reader::as<unsigned_int>(&local_2910);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_28b8,&local_28bc,&local_28c4);
  DynamicValue::Reader::~Reader(&local_2910);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_28b8);
  paVar4 = extraout_RDX_05;
  if (!bVar1) {
    local_2959 = kj::_::Debug::shouldLog(ERROR);
    paVar4 = extraout_RDX_06;
    while (local_2959 != false) {
      local_2960 = 0x141;
      DynamicStruct::Builder::asReader(&local_29e8,(Builder *)local_148);
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_14.result,"bar");
      DynamicStruct::Reader::get(&local_29b0,&local_29e8,(StringPtr)stack0xffffffffffffd608);
      local_2964 = DynamicValue::Reader::as<unsigned_int>(&local_29b0);
      kj::_::Debug::
      log<char_const(&)[67],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x17e,ERROR,
                 "\"failed: expected \" \"(321u) == (root.asReader().get(\\\"bar\\\").as<uint>())\", _kjCondition, 321u, root.asReader().get(\"bar\").as<uint>()"
                 ,(char (*) [67])
                  "failed: expected (321u) == (root.asReader().get(\"bar\").as<uint>())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_28b8,&local_2960,&local_2964);
      DynamicValue::Reader::~Reader(&local_29b0);
      paVar4 = extraout_RDX_07;
      local_2959 = false;
    }
  }
  _auStack_2ee8 = local_148;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase358::run()::__4>
            (&local_2ee0,(kj *)auStack_2ee8,paVar4);
  kj::_::DebugExpressionStart::operator<<
            (&local_2d48,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_2ee0);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_2bb0,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&local_2d48,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_2d48);
  kj::Maybe<kj::Exception>::~Maybe(&local_2ee0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2bb0);
  if (!bVar1) {
    _kjCondition_15._439_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_15._439_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[85],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x17f,ERROR,
                 "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.get(\\\"foo\\\"); }) != kj::none\", _kjCondition"
                 ,(char (*) [85])
                  "failed: expected ::kj::runCatchingExceptions([&]() { root.get(\"foo\"); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_2bb0);
      _kjCondition_15._439_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_2bb0);
  _auStack_33e0 = local_148;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase358::run()::__5>
            (&local_33d8,(kj *)auStack_33e0,func_01);
  kj::_::DebugExpressionStart::operator<<
            (&local_3240,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_33d8);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_30a8,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&local_3240,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_3240);
  kj::Maybe<kj::Exception>::~Maybe(&local_33d8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_30a8);
  if (!bVar1) {
    local_33e1 = kj::_::Debug::shouldLog(ERROR);
    while (local_33e1 != false) {
      kj::_::Debug::
      log<char_const(&)[96],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x180,ERROR,
                 "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.asReader().get(\\\"foo\\\"); }) != kj::none\", _kjCondition"
                 ,(char (*) [96])
                  "failed: expected ::kj::runCatchingExceptions([&]() { root.asReader().get(\"foo\"); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_30a8);
      local_33e1 = false;
    }
  }
  kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_30a8);
  kj::StringPtr::StringPtr((StringPtr *)&local_33f8,"foo");
  DynamicValue::Reader::Reader((Reader *)&_kjCondition_16.result,0x7b);
  DynamicStruct::Builder::set
            ((Builder *)local_148,(StringPtr)local_33f8,(Reader *)&_kjCondition_16.result);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_16.result);
  kj::StringPtr::StringPtr((StringPtr *)&local_3568,"foo");
  StructSchema::getFieldByName(&local_3558,(StructSchema *)&local_108,(StringPtr)local_3568);
  kj::_::DebugExpressionStart::operator<<
            (&local_3518,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3558);
  DynamicStruct::Builder::which(&local_3640,(Builder *)local_148);
  pNVar2 = kj::_::readMaybe<capnp::StructSchema::Field>(&local_3640);
  kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
            ((NullableValue<capnp::StructSchema::Field> *)local_35f8,pNVar2);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_3640);
  pFVar3 = kj::_::NullableValue::operator_cast_to_Field_((NullableValue *)local_35f8);
  if (pFVar3 == (Field *)0x0) {
    kj::_::Debug::Fault::Fault
              ((Fault *)&stack0xffffffffffffc9b8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x183,FAILED,"root.which() != nullptr","");
    kj::_::Debug::Fault::fatal((Fault *)&stack0xffffffffffffc9b8);
  }
  pNVar2 = kj::mv<kj::_::NullableValue<capnp::StructSchema::Field>>
                     ((NullableValue<capnp::StructSchema::Field> *)local_35f8);
  kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
            ((NullableValue<capnp::StructSchema::Field> *)
             &_kj_result_8.field_1.value.proto._reader.nestingLimit,pNVar2);
  kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
            ((NullableValue<capnp::StructSchema::Field> *)local_35f8);
  pFVar3 = kj::_::NullableValue<capnp::StructSchema::Field>::operator*
                     ((NullableValue<capnp::StructSchema::Field> *)
                      &_kj_result_8.field_1.value.proto._reader.nestingLimit);
  kj::_::DebugExpression<capnp::StructSchema::Field>::operator==
            ((DebugComparison<capnp::StructSchema::Field,_capnp::StructSchema::Field> *)local_34d8,
             &local_3518,pFVar3);
  kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
            ((NullableValue<capnp::StructSchema::Field> *)
             &_kj_result_8.field_1.value.proto._reader.nestingLimit);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_34d8);
  if (!bVar1) {
    local_3649 = kj::_::Debug::shouldLog(ERROR);
    while (local_3649 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_36a0,"foo");
      StructSchema::getFieldByName(&local_3690,(StructSchema *)&local_108,(StringPtr)local_36a0);
      DynamicStruct::Builder::which(&local_3778,(Builder *)local_148);
      pNVar2 = kj::_::readMaybe<capnp::StructSchema::Field>(&local_3778);
      kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
                ((NullableValue<capnp::StructSchema::Field> *)local_3730,pNVar2);
      kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_3778);
      pFVar3 = kj::_::NullableValue::operator_cast_to_Field_((NullableValue *)local_3730);
      if (pFVar3 == (Field *)0x0) {
        kj::_::Debug::Fault::Fault
                  ((Fault *)&_kjCondition_17.result,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                   ,0x183,FAILED,"root.which() != nullptr","");
        kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_17.result);
      }
      pNVar2 = kj::mv<kj::_::NullableValue<capnp::StructSchema::Field>>
                         ((NullableValue<capnp::StructSchema::Field> *)local_3730);
      kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
                ((NullableValue<capnp::StructSchema::Field> *)
                 &_kj_result_9.field_1.value.proto._reader.nestingLimit,pNVar2);
      kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
                ((NullableValue<capnp::StructSchema::Field> *)local_3730);
      pFVar3 = kj::_::NullableValue<capnp::StructSchema::Field>::operator*
                         ((NullableValue<capnp::StructSchema::Field> *)
                          &_kj_result_9.field_1.value.proto._reader.nestingLimit);
      kj::_::Debug::
      log<char_const(&)[387],kj::_::DebugComparison<capnp::StructSchema::Field,capnp::StructSchema::Field>&,capnp::StructSchema::Field,capnp::StructSchema::Field>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x183,ERROR,
                 "\"failed: expected \" \"(schema.getFieldByName(\\\"foo\\\")) == ((*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\\\", 387, ::kj::Exception::Type::FAILED, \\\"root.which()\\\" \\\" != nullptr\\\", \\\"\\\").fatal(); } kj::mv(_kj_result); })))\", _kjCondition, schema.getFieldByName(\"foo\"), (*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\", 387, ::kj::Exception::Type::FAILED, \"root.which()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); }))"
                 ,(char (*) [387])
                  "failed: expected (schema.getFieldByName(\"foo\")) == ((*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\", 387, ::kj::Exception::Type::FAILED, \"root.which()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); })))"
                 ,(DebugComparison<capnp::StructSchema::Field,_capnp::StructSchema::Field> *)
                  local_34d8,&local_3690,pFVar3);
      kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
                ((NullableValue<capnp::StructSchema::Field> *)
                 &_kj_result_9.field_1.value.proto._reader.nestingLimit);
      local_3649 = false;
    }
  }
  local_37a8 = 0x7b;
  local_37a4 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_37a8);
  kj::StringPtr::StringPtr((StringPtr *)auStack_3800,"foo");
  DynamicStruct::Builder::get(&local_37f0,(Builder *)local_148,(StringPtr)_auStack_3800);
  local_37ac = DynamicValue::Builder::as<unsigned_int>(&local_37f0);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_37a0,&local_37a4,&local_37ac);
  DynamicValue::Builder::~Builder(&local_37f0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_37a0);
  if (!bVar1) {
    local_3801 = kj::_::Debug::shouldLog(ERROR);
    while (local_3801 != false) {
      local_3808 = 0x7b;
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_18.result,"foo");
      DynamicStruct::Builder::get
                (&local_3850,(Builder *)local_148,(StringPtr)stack0xffffffffffffc7a0);
      local_380c = DynamicValue::Builder::as<unsigned_int>(&local_3850);
      kj::_::Debug::
      log<char_const(&)[56],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x184,ERROR,
                 "\"failed: expected \" \"(123u) == (root.get(\\\"foo\\\").as<uint>())\", _kjCondition, 123u, root.get(\"foo\").as<uint>()"
                 ,(char (*) [56])"failed: expected (123u) == (root.get(\"foo\").as<uint>())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_37a0,&local_3808,&local_380c);
      DynamicValue::Builder::~Builder(&local_3850);
      local_3801 = false;
    }
  }
  local_3888 = 0x7b;
  local_3884 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3888);
  DynamicStruct::Builder::asReader(&local_3910,(Builder *)local_148);
  kj::StringPtr::StringPtr((StringPtr *)auStack_3920,"foo");
  DynamicStruct::Reader::get(&local_38d8,&local_3910,(StringPtr)_auStack_3920);
  local_388c = DynamicValue::Reader::as<unsigned_int>(&local_38d8);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_3880,&local_3884,&local_388c);
  DynamicValue::Reader::~Reader(&local_38d8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3880);
  paVar4 = extraout_RDX_08;
  if (!bVar1) {
    local_3921 = kj::_::Debug::shouldLog(ERROR);
    paVar4 = extraout_RDX_09;
    while (local_3921 != false) {
      local_3928 = 0x7b;
      DynamicStruct::Builder::asReader(&local_39b0,(Builder *)local_148);
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_19.result,"foo");
      DynamicStruct::Reader::get(&local_3978,&local_39b0,(StringPtr)stack0xffffffffffffc640);
      local_392c = DynamicValue::Reader::as<unsigned_int>(&local_3978);
      kj::_::Debug::
      log<char_const(&)[67],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x185,ERROR,
                 "\"failed: expected \" \"(123u) == (root.asReader().get(\\\"foo\\\").as<uint>())\", _kjCondition, 123u, root.asReader().get(\"foo\").as<uint>()"
                 ,(char (*) [67])
                  "failed: expected (123u) == (root.asReader().get(\"foo\").as<uint>())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_3880,&local_3928,&local_392c);
      DynamicValue::Reader::~Reader(&local_3978);
      paVar4 = extraout_RDX_10;
      local_3921 = false;
    }
  }
  _auStack_3eb0 = local_148;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase358::run()::__6>
            (&local_3ea8,(kj *)auStack_3eb0,paVar4);
  kj::_::DebugExpressionStart::operator<<
            (&local_3d10,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3ea8);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_3b78,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&local_3d10,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_3d10);
  kj::Maybe<kj::Exception>::~Maybe(&local_3ea8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3b78);
  if (!bVar1) {
    _kjCondition_20._439_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_20._439_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[85],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x186,ERROR,
                 "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.get(\\\"bar\\\"); }) != kj::none\", _kjCondition"
                 ,(char (*) [85])
                  "failed: expected ::kj::runCatchingExceptions([&]() { root.get(\"bar\"); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_3b78);
      _kjCondition_20._439_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_3b78);
  _auStack_43a8 = local_148;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase358::run()::__7>
            (&local_43a0,(kj *)auStack_43a8,func_02);
  kj::_::DebugExpressionStart::operator<<
            (&local_4208,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_43a0);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_4070,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&local_4208,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_4208);
  kj::Maybe<kj::Exception>::~Maybe(&local_43a0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_4070);
  if (!bVar1) {
    local_43a9 = kj::_::Debug::shouldLog(ERROR);
    while (local_43a9 != false) {
      kj::_::Debug::
      log<char_const(&)[96],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x187,ERROR,
                 "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.asReader().get(\\\"bar\\\"); }) != kj::none\", _kjCondition"
                 ,(char (*) [96])
                  "failed: expected ::kj::runCatchingExceptions([&]() { root.asReader().get(\"bar\"); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_4070);
      local_43a9 = false;
    }
  }
  kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_4070);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&schema);
  return;
}

Assistant:

TEST(DynamicApi, UnnamedUnion) {
  MallocMessageBuilder builder;
  StructSchema schema = Schema::from<test::TestUnnamedUnion>();
  auto root = builder.initRoot<DynamicStruct>(schema);

  EXPECT_EQ(schema.getFieldByName("foo"), KJ_ASSERT_NONNULL(root.which()));

  root.set("bar", 321);
  EXPECT_EQ(schema.getFieldByName("bar"), KJ_ASSERT_NONNULL(root.which()));
  EXPECT_EQ(321u, root.get("bar").as<uint>());
  EXPECT_EQ(321u, root.asReader().get("bar").as<uint>());
  EXPECT_ANY_THROW(root.get("foo"));
  EXPECT_ANY_THROW(root.asReader().get("foo"));

  root.set("foo", 123);
  EXPECT_EQ(schema.getFieldByName("foo"), KJ_ASSERT_NONNULL(root.which()));
  EXPECT_EQ(123u, root.get("foo").as<uint>());
  EXPECT_EQ(123u, root.asReader().get("foo").as<uint>());
  EXPECT_ANY_THROW(root.get("bar"));
  EXPECT_ANY_THROW(root.asReader().get("bar"));

  root.set("bar", 321);
  EXPECT_EQ(schema.getFieldByName("bar"), KJ_ASSERT_NONNULL(root.which()));
  EXPECT_EQ(321u, root.get("bar").as<uint>());
  EXPECT_EQ(321u, root.asReader().get("bar").as<uint>());
  EXPECT_ANY_THROW(root.get("foo"));
  EXPECT_ANY_THROW(root.asReader().get("foo"));

  root.set("foo", 123);
  EXPECT_EQ(schema.getFieldByName("foo"), KJ_ASSERT_NONNULL(root.which()));
  EXPECT_EQ(123u, root.get("foo").as<uint>());
  EXPECT_EQ(123u, root.asReader().get("foo").as<uint>());
  EXPECT_ANY_THROW(root.get("bar"));
  EXPECT_ANY_THROW(root.asReader().get("bar"));
}